

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApiDebug.cpp
# Opt level: O0

void loadTriangleProgram(void)

{
  bool bVar1;
  djg_program *program;
  char *file;
  runtime_error *this;
  char local_418 [8];
  char buf [1024];
  GLuint *glp;
  djg_program *djp;
  
  program = djgp_create();
  builtin_strncpy(buf + 0x3f8,"Xi$",4);
  buf[0x3fc] = '\0';
  buf[0x3fd] = '\0';
  buf[0x3fe] = '\0';
  buf[0x3ff] = '\0';
  if (g_params.mode == 0) {
    djgp_push_string(program,"#define MODE_TRIANGLE\n");
  }
  else {
    djgp_push_string(program,"#define MODE_QUAD\n");
  }
  djgp_push_file(program,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/GLSL/LongestEdgeBisection.glsl"
                );
  file = strcat2(local_418,g_app.dir.shader,"Triangle.glsl");
  djgp_push_file(program,file);
  bVar1 = djgp_to_gl(program,0x1c2,false,true,(GLuint *)buf._1016_8_);
  if (!bVar1) {
    djgp_release(program);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"shader creation error");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  djgp_release(program);
  return;
}

Assistant:

void loadTriangleProgram()
{
    djg_program *djp = djgp_create();
    GLuint *glp = &g_gl.programs[PROGRAM_TRIANGLE];
    char buf[1024];

    if (g_params.mode == MODE_TRIANGLE)
        djgp_push_string(djp, "#define MODE_TRIANGLE\n");
    else
        djgp_push_string(djp, "#define MODE_QUAD\n");

    djgp_push_file(djp, PATH_TO_LEB_GLSL_LIBRARY "LongestEdgeBisection.glsl");
    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "Triangle.glsl"));
    if (!djgp_to_gl(djp, 450, false, true, glp)) {
        djgp_release(djp);

        throw std::runtime_error("shader creation error");
    }
    djgp_release(djp);
}